

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

int mbedtls_sha256_finish(mbedtls_sha256_context_conflict *ctx,uchar *output)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  int truncated;
  uint32_t low;
  uint32_t high;
  uint32_t used;
  int ret;
  uchar *output_local;
  mbedtls_sha256_context_conflict *ctx_local;
  
  uVar2 = ctx->total[0] & 0x3f;
  uVar3 = uVar2 + 1;
  ctx->buffer[uVar2] = 0x80;
  if (uVar3 < 0x39) {
    memset(ctx->buffer + uVar3,0,(ulong)(0x38 - uVar3));
  }
  else {
    memset(ctx->buffer + uVar3,0,(ulong)(0x40 - uVar3));
    high = mbedtls_internal_sha256_process(ctx,ctx->buffer);
    if (high != 0) goto LAB_0037f563;
    memset(ctx,0,0x38);
  }
  uVar3 = ctx->total[1] << 3;
  uVar1 = ctx->total[0];
  uVar2 = uVar1 << 3;
  mbedtls_put_unaligned_uint32
            (ctx->buffer + 0x38,
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
             (ctx->total[0] >> 0x1d | uVar3) << 0x18);
  mbedtls_put_unaligned_uint32
            (ctx->buffer + 0x3c,
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar1 << 0x1b);
  high = mbedtls_internal_sha256_process(ctx,ctx->buffer);
  if (high == 0) {
    uVar2 = ctx->state[0];
    mbedtls_put_unaligned_uint32
              (output,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18);
    uVar2 = ctx->state[1];
    mbedtls_put_unaligned_uint32
              (output + 4,
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    uVar2 = ctx->state[2];
    mbedtls_put_unaligned_uint32
              (output + 8,
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    uVar2 = ctx->state[3];
    mbedtls_put_unaligned_uint32
              (output + 0xc,
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    uVar2 = ctx->state[4];
    mbedtls_put_unaligned_uint32
              (output + 0x10,
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    uVar2 = ctx->state[5];
    mbedtls_put_unaligned_uint32
              (output + 0x14,
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    uVar2 = ctx->state[6];
    mbedtls_put_unaligned_uint32
              (output + 0x18,
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    if (ctx->is224 == 0) {
      uVar2 = ctx->state[7];
      mbedtls_put_unaligned_uint32
                (output + 0x1c,
                 uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    }
    high = 0;
  }
LAB_0037f563:
  mbedtls_sha256_free(ctx);
  return high;
}

Assistant:

int mbedtls_sha256_finish(mbedtls_sha256_context *ctx,
                          unsigned char *output)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    uint32_t used;
    uint32_t high, low;
    int truncated = 0;

    /*
     * Add padding: 0x80 then 0x00 until 8 bytes remain for the length
     */
    used = ctx->total[0] & 0x3F;

    ctx->buffer[used++] = 0x80;

    if (used <= 56) {
        /* Enough room for padding + length in current block */
        memset(ctx->buffer + used, 0, 56 - used);
    } else {
        /* We'll need an extra block */
        memset(ctx->buffer + used, 0, SHA256_BLOCK_SIZE - used);

        if ((ret = mbedtls_internal_sha256_process(ctx, ctx->buffer)) != 0) {
            goto exit;
        }

        memset(ctx->buffer, 0, 56);
    }

    /*
     * Add message length
     */
    high = (ctx->total[0] >> 29)
           | (ctx->total[1] <<  3);
    low  = (ctx->total[0] <<  3);

    MBEDTLS_PUT_UINT32_BE(high, ctx->buffer, 56);
    MBEDTLS_PUT_UINT32_BE(low,  ctx->buffer, 60);

    if ((ret = mbedtls_internal_sha256_process(ctx, ctx->buffer)) != 0) {
        goto exit;
    }

    /*
     * Output final state
     */
    MBEDTLS_PUT_UINT32_BE(ctx->state[0], output,  0);
    MBEDTLS_PUT_UINT32_BE(ctx->state[1], output,  4);
    MBEDTLS_PUT_UINT32_BE(ctx->state[2], output,  8);
    MBEDTLS_PUT_UINT32_BE(ctx->state[3], output, 12);
    MBEDTLS_PUT_UINT32_BE(ctx->state[4], output, 16);
    MBEDTLS_PUT_UINT32_BE(ctx->state[5], output, 20);
    MBEDTLS_PUT_UINT32_BE(ctx->state[6], output, 24);

#if defined(MBEDTLS_SHA224_C)
    truncated = ctx->is224;
#endif
    if (!truncated) {
        MBEDTLS_PUT_UINT32_BE(ctx->state[7], output, 28);
    }

    ret = 0;

exit:
    mbedtls_sha256_free(ctx);
    return ret;
}